

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Eigen_Colamd.h
# Opt level: O1

int Eigen::internal::init_rows_cols<int>
              (int n_row,int n_col,Colamd_Row<int> *Row,colamd_col<int> *Col,int *A,int *p,
              int *stats)

{
  colamd_col<int> *pcVar1;
  int *piVar2;
  int iVar3;
  anon_union_4_2_34273927_for_shared1 aVar4;
  int iVar5;
  anon_union_4_2_db423fdf_for_shared4 *paVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  int *piVar11;
  int iVar12;
  bool bVar13;
  
  uVar9 = (ulong)(uint)n_col;
  if (0 < n_col) {
    paVar6 = &Col->shared4;
    uVar8 = 0;
    do {
      ((colamd_col<int> *)(paVar6 + -5))->start = p[uVar8];
      iVar7 = p[uVar8 + 1];
      iVar12 = p[uVar8];
      paVar6[-4].degree_next = iVar7 - iVar12;
      if (iVar7 - iVar12 < 0) {
        stats[3] = -8;
        stats[4] = (int)uVar8;
        stats[5] = *(int *)(paVar6 + -4);
        return 0;
      }
      uVar8 = uVar8 + 1;
      *(undefined8 *)(paVar6 + -3) = 1;
      *(undefined8 *)(paVar6 + -1) = 0xffffffffffffffff;
      paVar6 = paVar6 + 6;
    } while (uVar9 != uVar8);
  }
  stats[6] = 0;
  if (0 < n_row) {
    lVar10 = 0;
    do {
      *(undefined4 *)((long)&Row->length + lVar10) = 0;
      *(undefined4 *)((long)&Row->shared2 + lVar10) = 0xffffffff;
      lVar10 = lVar10 + 0x10;
    } while ((ulong)(uint)n_row << 4 != lVar10);
  }
  if (0 < n_col) {
    uVar8 = 0;
    do {
      iVar7 = p[uVar8 + 1];
      if (p[uVar8] < iVar7) {
        piVar11 = A + p[uVar8];
        iVar12 = -1;
        do {
          iVar3 = *piVar11;
          lVar10 = (long)iVar3;
          iVar5 = (int)uVar8;
          if ((lVar10 < 0) || (n_row <= iVar3)) {
            stats[3] = -9;
            stats[4] = iVar5;
            stats[5] = iVar3;
            stats[6] = n_row;
            return 0;
          }
          if ((iVar3 <= iVar12) || (uVar8 == (uint)Row[lVar10].shared2.mark)) {
            stats[3] = 1;
            stats[4] = iVar5;
            stats[5] = iVar3;
            stats[6] = stats[6] + 1;
          }
          bVar13 = uVar8 != (uint)Row[lVar10].shared2.mark;
          pcVar1 = Col + uVar8;
          if (bVar13) {
            pcVar1 = (colamd_col<int> *)(Row + lVar10);
          }
          piVar11 = piVar11 + 1;
          pcVar1->length = pcVar1->length + (uint)bVar13 * 2 + -1;
          Row[lVar10].shared2.mark = iVar5;
          iVar12 = iVar3;
        } while (piVar11 < A + iVar7);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar9);
  }
  aVar4 = *(anon_union_4_2_34273927_for_shared1 *)(p + uVar9);
  Row->start = (int)aVar4;
  Row->shared1 = aVar4;
  (Row->shared2).mark = -1;
  if (1 < n_row) {
    lVar10 = 0x10;
    do {
      iVar7 = *(int *)((long)Row + lVar10 + -0xc) + *(int *)((long)&Row[-1].start + lVar10);
      *(int *)((long)&Row->start + lVar10) = iVar7;
      *(int *)((long)&Row->shared1 + lVar10) = iVar7;
      *(undefined4 *)((long)&Row->shared2 + lVar10) = 0xffffffff;
      lVar10 = lVar10 + 0x10;
    } while ((ulong)(uint)n_row << 4 != lVar10);
  }
  if (stats[3] == 1) {
    if (0 < n_col) {
      uVar8 = 0;
      do {
        iVar7 = p[uVar8 + 1];
        if (p[uVar8] < iVar7) {
          piVar11 = A + p[uVar8];
          do {
            iVar12 = *piVar11;
            if (uVar8 != (uint)Row[iVar12].shared2.mark) {
              iVar3 = Row[iVar12].shared1.degree;
              Row[iVar12].shared1.degree = iVar3 + 1;
              A[iVar3] = (int)uVar8;
              Row[iVar12].shared2.mark = (int)uVar8;
            }
            piVar11 = piVar11 + 1;
          } while (piVar11 < A + iVar7);
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 != uVar9);
    }
  }
  else if (0 < n_col) {
    uVar8 = 0;
    do {
      iVar7 = p[uVar8 + 1];
      if (p[uVar8] < iVar7) {
        piVar11 = A + p[uVar8];
        do {
          iVar12 = *piVar11;
          piVar11 = piVar11 + 1;
          iVar3 = Row[iVar12].shared1.degree;
          Row[iVar12].shared1.degree = iVar3 + 1;
          A[iVar3] = (int)uVar8;
        } while (piVar11 < A + iVar7);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar9);
  }
  if (0 < n_row) {
    lVar10 = 0;
    do {
      *(undefined4 *)((long)&Row->shared2 + lVar10) = 0;
      *(undefined4 *)((long)&Row->shared1 + lVar10) = *(undefined4 *)((long)&Row->length + lVar10);
      lVar10 = lVar10 + 0x10;
    } while ((ulong)(uint)n_row << 4 != lVar10);
  }
  if (stats[3] == 1) {
    Col->start = 0;
    *p = 0;
    if (1 < n_col) {
      uVar8 = 1;
      do {
        iVar7 = Col->length + Col->start;
        Col[1].start = iVar7;
        Col = Col + 1;
        p[uVar8] = iVar7;
        uVar8 = uVar8 + 1;
      } while (uVar9 != uVar8);
    }
    if (0 < n_row) {
      uVar9 = 0;
      do {
        if (0 < (long)Row[uVar9].length) {
          piVar11 = A + Row[uVar9].start;
          piVar2 = piVar11 + Row[uVar9].length;
          do {
            iVar7 = *piVar11;
            piVar11 = piVar11 + 1;
            iVar12 = p[iVar7];
            p[iVar7] = iVar12 + 1;
            A[iVar12] = (int)uVar9;
          } while (piVar11 < piVar2);
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 != (uint)n_row);
    }
  }
  return 1;
}

Assistant:

static Index init_rows_cols  /* returns true if OK, or false otherwise */
  (
    /* === Parameters ======================================================= */

    Index n_row,      /* number of rows of A */
    Index n_col,      /* number of columns of A */
    Colamd_Row<Index> Row [],    /* of size n_row+1 */
    colamd_col<Index> Col [],    /* of size n_col+1 */
    Index A [],     /* row indices of A, of size Alen */
    Index p [],     /* pointers to columns in A, of size n_col+1 */
    Index stats [COLAMD_STATS]  /* colamd statistics */ 
    )
{
  /* === Local variables ================================================== */

  Index col ;     /* a column index */
  Index row ;     /* a row index */
  Index *cp ;     /* a column pointer */
  Index *cp_end ;   /* a pointer to the end of a column */
  Index *rp ;     /* a row pointer */
  Index *rp_end ;   /* a pointer to the end of a row */
  Index last_row ;    /* previous row */

  /* === Initialize columns, and check column pointers ==================== */

  for (col = 0 ; col < n_col ; col++)
  {
    Col [col].start = p [col] ;
    Col [col].length = p [col+1] - p [col] ;

    if (Col [col].length < 0)
    {
      /* column pointers must be non-decreasing */
      stats [COLAMD_STATUS] = COLAMD_ERROR_col_length_negative ;
      stats [COLAMD_INFO1] = col ;
      stats [COLAMD_INFO2] = Col [col].length ;
      COLAMD_DEBUG0 (("colamd: col %d length %d < 0\n", col, Col [col].length)) ;
      return (false) ;
    }

    Col [col].shared1.thickness = 1 ;
    Col [col].shared2.score = 0 ;
    Col [col].shared3.prev = COLAMD_EMPTY ;
    Col [col].shared4.degree_next = COLAMD_EMPTY ;
  }

  /* p [0..n_col] no longer needed, used as "head" in subsequent routines */

  /* === Scan columns, compute row degrees, and check row indices ========= */

  stats [COLAMD_INFO3] = 0 ;  /* number of duplicate or unsorted row indices*/

  for (row = 0 ; row < n_row ; row++)
  {
    Row [row].length = 0 ;
    Row [row].shared2.mark = -1 ;
  }

  for (col = 0 ; col < n_col ; col++)
  {
    last_row = -1 ;

    cp = &A [p [col]] ;
    cp_end = &A [p [col+1]] ;

    while (cp < cp_end)
    {
      row = *cp++ ;

      /* make sure row indices within range */
      if (row < 0 || row >= n_row)
      {
	stats [COLAMD_STATUS] = COLAMD_ERROR_row_index_out_of_bounds ;
	stats [COLAMD_INFO1] = col ;
	stats [COLAMD_INFO2] = row ;
	stats [COLAMD_INFO3] = n_row ;
	COLAMD_DEBUG0 (("colamd: row %d col %d out of bounds\n", row, col)) ;
	return (false) ;
      }

      if (row <= last_row || Row [row].shared2.mark == col)
      {
	/* row index are unsorted or repeated (or both), thus col */
	/* is jumbled.  This is a notice, not an error condition. */
	stats [COLAMD_STATUS] = COLAMD_OK_BUT_JUMBLED ;
	stats [COLAMD_INFO1] = col ;
	stats [COLAMD_INFO2] = row ;
	(stats [COLAMD_INFO3]) ++ ;
	COLAMD_DEBUG1 (("colamd: row %d col %d unsorted/duplicate\n",row,col));
      }

      if (Row [row].shared2.mark != col)
      {
	Row [row].length++ ;
      }
      else
      {
	/* this is a repeated entry in the column, */
	/* it will be removed */
	Col [col].length-- ;
      }

      /* mark the row as having been seen in this column */
      Row [row].shared2.mark = col ;

      last_row = row ;
    }
  }

  /* === Compute row pointers ============================================= */

  /* row form of the matrix starts directly after the column */
  /* form of matrix in A */
  Row [0].start = p [n_col] ;
  Row [0].shared1.p = Row [0].start ;
  Row [0].shared2.mark = -1 ;
  for (row = 1 ; row < n_row ; row++)
  {
    Row [row].start = Row [row-1].start + Row [row-1].length ;
    Row [row].shared1.p = Row [row].start ;
    Row [row].shared2.mark = -1 ;
  }

  /* === Create row form ================================================== */

  if (stats [COLAMD_STATUS] == COLAMD_OK_BUT_JUMBLED)
  {
    /* if cols jumbled, watch for repeated row indices */
    for (col = 0 ; col < n_col ; col++)
    {
      cp = &A [p [col]] ;
      cp_end = &A [p [col+1]] ;
      while (cp < cp_end)
      {
	row = *cp++ ;
	if (Row [row].shared2.mark != col)
	{
	  A [(Row [row].shared1.p)++] = col ;
	  Row [row].shared2.mark = col ;
	}
      }
    }
  }
  else
  {
    /* if cols not jumbled, we don't need the mark (this is faster) */
    for (col = 0 ; col < n_col ; col++)
    {
      cp = &A [p [col]] ;
      cp_end = &A [p [col+1]] ;
      while (cp < cp_end)
      {
	A [(Row [*cp++].shared1.p)++] = col ;
      }
    }
  }

  /* === Clear the row marks and set row degrees ========================== */

  for (row = 0 ; row < n_row ; row++)
  {
    Row [row].shared2.mark = 0 ;
    Row [row].shared1.degree = Row [row].length ;
  }

  /* === See if we need to re-create columns ============================== */

  if (stats [COLAMD_STATUS] == COLAMD_OK_BUT_JUMBLED)
  {
    COLAMD_DEBUG0 (("colamd: reconstructing column form, matrix jumbled\n")) ;


    /* === Compute col pointers ========================================= */

    /* col form of the matrix starts at A [0]. */
    /* Note, we may have a gap between the col form and the row */
    /* form if there were duplicate entries, if so, it will be */
    /* removed upon the first garbage collection */
    Col [0].start = 0 ;
    p [0] = Col [0].start ;
    for (col = 1 ; col < n_col ; col++)
    {
      /* note that the lengths here are for pruned columns, i.e. */
      /* no duplicate row indices will exist for these columns */
      Col [col].start = Col [col-1].start + Col [col-1].length ;
      p [col] = Col [col].start ;
    }

    /* === Re-create col form =========================================== */

    for (row = 0 ; row < n_row ; row++)
    {
      rp = &A [Row [row].start] ;
      rp_end = rp + Row [row].length ;
      while (rp < rp_end)
      {
	A [(p [*rp++])++] = row ;
      }
    }
  }

  /* === Done.  Matrix is not (or no longer) jumbled ====================== */

  return (true) ;
}